

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O3

int pdot(sunrealtype t,N_Vector yvec,N_Vector ydotvec,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pdVar3 = (double *)N_VGetArrayPointer();
  pdVar4 = (double *)N_VGetArrayPointer(ydotvec);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  dVar5 = sin(t / 3.141592653589793);
  dVar6 = cos(t * 0.5);
  dVar7 = cos(t * 0.5);
  *pdVar4 = -(dVar7 * dVar6 * dVar2 + dVar5 * 0.018 * dVar1);
  return 0;
}

Assistant:

int pdot(sunrealtype t, N_Vector yvec, N_Vector ydotvec, void* user_data)
{
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  sunrealtype* ydot   = N_VGetArrayPointer(ydotvec);
  const sunrealtype p = y[0];
  const sunrealtype q = y[1];

  ydot[0] = -(F(t) * p + omega(t) * omega(t) * q);

  return 0;
}